

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O0

void __thiscall jsonip::writer<false>::pre(writer<false> *this)

{
  writer<false> *this_local;
  
  if ((this->comma & 1U) != 0) {
    std::operator<<(this->os,", ");
  }
  return;
}

Assistant:

void pre()
        {
            if (indent_)
            {
                if (comma)
                    os << "," << '\n' << indent();
            }
            else
            {
                if (comma)
                    os << ", ";
            }
        }